

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

int __thiscall
libchars::terminal_driver::cursor_position
          (terminal_driver *this,size_t *x,size_t *y,ssize_t timeout_ms)

{
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  undefined1 auStack_58 [8];
  timeval T_start;
  undefined1 local_40 [8];
  timeval T_now;
  
  *y = 0;
  *x = 0;
  sVar4 = write(this,0x115cd4,(void *)0x4,timeout_ms);
  if ((int)sVar4 == 0) {
    lVar12 = 5000;
    if (-1 < timeout_ms) {
      lVar12 = timeout_ms;
    }
    auStack_58 = (undefined1  [8])0x0;
    T_start.tv_sec = 0;
    gettimeofday((timeval *)auStack_58,(__timezone_ptr_t)0x0);
    lVar6 = (long)auStack_58 * 1000;
    uVar11 = (ulong)T_start.tv_sec / 1000;
    do {
      uVar9 = this->rbuf_enq;
      uVar8 = this->rbuf_deq;
      if ((uVar8 + 6 <= uVar9) && (uVar8 < uVar9)) {
        uVar7 = this->rbuf_size;
        uVar1 = uVar7 - 1;
        puVar2 = this->rbuf;
        bVar13 = 0;
        do {
          uVar5 = uVar8 + 1;
          if (bVar13 < 4) {
            uVar10 = (uint)puVar2[uVar8 & uVar1];
            switch(bVar13) {
            case 0:
              bVar13 = uVar10 == 0x1b;
              if ((bool)bVar13) {
                uVar7 = uVar8;
              }
              break;
            case 1:
              if (uVar10 != 0x5b) {
                uVar7 = this->rbuf_size;
              }
              bVar13 = (uVar10 == 0x5b) * '\x02';
              break;
            case 2:
              bVar13 = 3;
              if (uVar10 != 0x3b) {
                if (9 < uVar10 - 0x30) goto LAB_00112c1c;
                *y = (ulong)(uVar10 - 0x30) + *y * 10;
                bVar13 = 2;
              }
              break;
            case 3:
              if (uVar10 == 0x52) {
                uVar11 = uVar5;
                uVar8 = uVar7;
                if (uVar5 < uVar9) {
                  do {
                    this->rbuf[uVar8 & uVar1] = this->rbuf[uVar11 & uVar1];
                    uVar11 = uVar11 + 1;
                    uVar9 = this->rbuf_enq;
                    uVar8 = uVar8 + 1;
                  } while (uVar11 < uVar9);
                }
                this->rbuf_enq = (uVar9 + uVar7) - uVar5;
                return 0;
              }
              if (uVar10 - 0x30 < 10) {
                *x = (ulong)(uVar10 - 0x30) + *x * 10;
                bVar13 = 3;
              }
              else {
LAB_00112c1c:
                bVar13 = 0;
                uVar7 = this->rbuf_size;
              }
            }
          }
          uVar9 = this->rbuf_enq;
          uVar8 = uVar5;
        } while (uVar5 < uVar9);
      }
      iVar3 = read_characters(this,true);
      if (iVar3 < 0) {
        return iVar3;
      }
    } while ((iVar3 != 0) ||
            ((iVar3 = gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0), iVar3 == 0 &&
             ((ulong)T_now.tv_sec / 1000 + (long)local_40 * 1000 < uVar11 + lVar6 + lVar12))));
  }
  return -1;
}

Assistant:

int terminal_driver::cursor_position(size_t &x, size_t &y, ssize_t timeout_ms)
    {
        x = y = 0;

        //XXX: do not check for 'control_enabled' because this function is used to determine 'control_enabled'

        if (timeout_ms < 0)
            timeout_ms = LC_CURSOR_POSITION_READ_TIMEOUT_ms;

        int r = write("\x1b[6n", 4);
        if (r != 0)
            return r;

        struct timeval T_start = { 0, 0 };
        gettimeofday(&T_start, NULL);

        while (true) {
            // search for pattern: ^[yyy;xxxR  (minimum of 6 characters)
            if (rbuf_enq >= (rbuf_deq + 6)) {
                enum { WAIT_ESC0, WAIT_ESC1, WAIT_SEMI, WAIT_TERM } seq_state = WAIT_ESC0;
                size_t rbuf_mask = (rbuf_size - 1);
                size_t rbuf_search = rbuf_deq;
                size_t rbuf_found = rbuf_size;
                while (rbuf_search < rbuf_enq) {
                    uint8_t c = *(rbuf + (rbuf_search & rbuf_mask));
                    switch (seq_state) {
                    case WAIT_ESC0:
                        if (c == 0x1b) {
                            seq_state = WAIT_ESC1;
                            rbuf_found = rbuf_search;
                        }
                        break;
                    case WAIT_ESC1:
                        if (c == '[') {
                            seq_state = WAIT_SEMI;
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_SEMI:
                        if (c == ';') {
                            seq_state = WAIT_TERM;
                        }
                        else if (isdigit(c)) {
                            y = y*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    case WAIT_TERM:
                        if (c == 'R') {
                            // pattern found; remove bytes from buffer
                            ++rbuf_search;
                            size_t rbuf_copy_to = rbuf_found;
                            size_t rbuf_copy_from = rbuf_search;
                            while (rbuf_copy_from < rbuf_enq) {
                                *(rbuf + (rbuf_copy_to & rbuf_mask)) = *(rbuf + (rbuf_copy_from & rbuf_mask));
                                ++rbuf_copy_to;
                                ++rbuf_copy_from;
                            }
                            rbuf_enq -= (rbuf_search - rbuf_found);
                            return 0;
                        }
                        else if (isdigit(c)) {
                            x = x*10 + (c-'0');
                        }
                        else {
                            seq_state = WAIT_ESC0;
                            rbuf_found = rbuf_size;
                        }
                        break;
                    }
                    ++rbuf_search;
                }
            }
            // pattern not found; need more characters
            r = read_characters(true);
            if (r < 0)
                return r;
            else if (r == 0) {
                // timeout logic
                struct timeval T_now;
                if (gettimeofday(&T_now, NULL) == 0) {
                    uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                    uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
                    if (t_msec_now >= (t_msec_start + timeout_ms))
                        return -1;
                }
                else {
                    return -1;
                }
            }
        }
    }